

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

bool __thiscall Fossilize::CLIParser::parse(CLIParser *this)

{
  char **ppcVar1;
  iterator iVar2;
  bool bVar3;
  pointer ppVar4;
  byte local_61;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
  local_58;
  allocator local_49;
  key_type local_48;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
  local_28;
  iterator itr;
  char *next;
  CLIParser *this_local;
  
  while( true ) {
    local_61 = 0;
    if (this->argc != 0) {
      local_61 = this->ended_state ^ 0xff;
    }
    if ((local_61 & 1) == 0) break;
    ppcVar1 = this->argv;
    this->argv = ppcVar1 + 1;
    itr.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
               )*ppcVar1;
    this->argc = this->argc + -1;
    if ((*(char *)&(((__node_type *)
                    itr.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                    ._M_cur)->super__Hash_node_base)._M_nxt == '-') ||
       (bVar3 = std::function::operator_cast_to_bool((function *)&(this->cbs).default_handler),
       !bVar3)) {
      iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
      ._M_cur = itr.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                ._M_cur;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_48,
                 (char *)iVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                         ._M_cur,&local_49);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>_>
                   *)this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      local_58._M_cur =
           (__node_type *)
           std::
           end<std::unordered_map<std::__cxx11::string,std::function<void(Fossilize::CLIParser&)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(Fossilize::CLIParser&)>>>>>
                     ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>_>_>
                       *)this);
      bVar3 = std::__detail::operator==(&local_28,&local_58);
      if (bVar3) {
        if ((this->unknown_argument_is_default & 1U) == 0) {
          fprintf(_stderr,"Fossilize ERROR: Invalid argument.\n");
          fflush(_stderr);
          bVar3 = std::function::operator_cast_to_bool((function *)&(this->cbs).error_handler);
          if (bVar3) {
            std::function<void_()>::operator()(&(this->cbs).error_handler);
          }
          return false;
        }
        std::function<void_(const_char_*)>::operator()
                  (&(this->cbs).default_handler,
                   (char *)itr.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                           ._M_cur);
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_false,_true>
                               *)&local_28);
        std::function<void_(Fossilize::CLIParser_&)>::operator()(&ppVar4->second,this);
      }
    }
    else {
      std::function<void_(const_char_*)>::operator()
                (&(this->cbs).default_handler,
                 (char *)itr.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(Fossilize::CLIParser_&)>_>,_true>
                         ._M_cur);
    }
  }
  return true;
}

Assistant:

bool CLIParser::parse()
{
	while (argc && !ended_state)
	{
		const char *next = *argv++;
		argc--;

		if (*next != '-' && cbs.default_handler)
		{
			cbs.default_handler(next);
		}
		else
		{
			auto itr = cbs.callbacks.find(next);
			if (itr == ::end(cbs.callbacks))
			{
				if (unknown_argument_is_default)
					cbs.default_handler(next);
				else
				{
					LOGE("Invalid argument.\n");
					if (cbs.error_handler)
						cbs.error_handler();
					return false;
				}
			}
			else
				itr->second(*this);
		}
	}

	return true;
}